

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VScaleAddMultiVectorArray(int nvec,int nsum,realtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  N_Vector *__ptr;
  N_Vector *__ptr_00;
  N_Vector *ZZ;
  N_Vector *YY;
  realtype ONE;
  int local_40;
  int ier;
  int j;
  int i;
  N_Vector **Z_local;
  N_Vector **Y_local;
  N_Vector *X_local;
  realtype *a_local;
  int nsum_local;
  int nvec_local;
  
  if ((*X)->ops->nvscaleaddmultivectorarray ==
      (_func_int_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)0x0) {
    if ((*X)->ops->nvscaleaddmulti ==
        (_func_int_int_realtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0) {
      for (ier = 0; ier < nvec; ier = ier + 1) {
        for (local_40 = 0; local_40 < nsum; local_40 = local_40 + 1) {
          (*(*X)->ops->nvlinearsum)(a[local_40],X[ier],1.0,Y[local_40][ier],Z[local_40][ier]);
        }
      }
      nsum_local = 0;
    }
    else {
      __ptr = (N_Vector *)malloc((long)nsum << 3);
      __ptr_00 = (N_Vector *)malloc((long)nsum << 3);
      for (ier = 0; ier < nvec; ier = ier + 1) {
        for (local_40 = 0; local_40 < nsum; local_40 = local_40 + 1) {
          __ptr[local_40] = Y[local_40][ier];
          __ptr_00[local_40] = Z[local_40][ier];
        }
        ONE._4_4_ = (*(*X)->ops->nvscaleaddmulti)(nsum,a,X[ier],__ptr,__ptr_00);
        if (ONE._4_4_ != 0) break;
      }
      free(__ptr);
      free(__ptr_00);
      nsum_local = ONE._4_4_;
    }
  }
  else {
    nsum_local = (*(*X)->ops->nvscaleaddmultivectorarray)(nvec,nsum,a,X,Y,Z);
  }
  return nsum_local;
}

Assistant:

int N_VScaleAddMultiVectorArray(int nvec, int nsum, realtype* a, N_Vector* X,
                                 N_Vector** Y, N_Vector** Z)
{
  int       i, j, ier;
  realtype  ONE=RCONST(1.0);
  N_Vector* YY=NULL;
  N_Vector* ZZ=NULL;

  if (X[0]->ops->nvscaleaddmultivectorarray != NULL) {

    ier = X[0]->ops->nvscaleaddmultivectorarray(nvec, nsum, a, X, Y, Z);
    return(ier);

  } else if (X[0]->ops->nvscaleaddmulti != NULL ) {

    /* allocate arrays of vectors */
    YY = (N_Vector *) malloc(nsum * sizeof(N_Vector));
    ZZ = (N_Vector *) malloc(nsum * sizeof(N_Vector));

    for (i=0; i<nvec; i++) {

      for (j=0; j<nsum; j++) {
        YY[j] = Y[j][i];
        ZZ[j] = Z[j][i];
      }

      ier = X[0]->ops->nvscaleaddmulti(nsum, a, X[i], YY, ZZ);
      if (ier != 0) break;
    }

    /* free array of vectors */
    free(YY);
    free(ZZ);

    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      for (j=0; j<nsum; j++) {
        X[0]->ops->nvlinearsum(a[j], X[i], ONE, Y[j][i], Z[j][i]);
      }
    }
    return(0);
  }
}